

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O1

PreprocessorOptions * __thiscall slang::Bag::get<slang::parsing::PreprocessorOptions>(Bag *this)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  char *__s2;
  uint uVar5;
  undefined1 auVar6 [16];
  ushort uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  int iVar12;
  size_t sVar13;
  PreprocessorOptions *pPVar14;
  uint uVar15;
  ulong uVar16;
  value_type_pointer unaff_RBX;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  
  sVar13 = std::type_info::hash_code((type_info *)&parsing::PreprocessorOptions::typeinfo);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar13;
  uVar16 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar17 = uVar16 >> ((byte)(this->items).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar2 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_;
  lVar18 = (uVar16 & 0xff) * 4;
  uVar8 = (&UNK_0046cabc)[lVar18];
  uVar9 = (&UNK_0046cabd)[lVar18];
  uVar10 = (&UNK_0046cabe)[lVar18];
  uVar11 = (&UNK_0046cabf)[lVar18];
  ppVar3 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  uVar4 = (this->items).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
          .arrays.groups_size_mask;
  uVar19 = 0;
  do {
    pgVar1 = pgVar2 + uVar17;
    auVar21[0] = -(pgVar1->m[0].n == uVar8);
    auVar21[1] = -(pgVar1->m[1].n == uVar9);
    auVar21[2] = -(pgVar1->m[2].n == uVar10);
    auVar21[3] = -(pgVar1->m[3].n == uVar11);
    auVar21[4] = -(pgVar1->m[4].n == uVar8);
    auVar21[5] = -(pgVar1->m[5].n == uVar9);
    auVar21[6] = -(pgVar1->m[6].n == uVar10);
    auVar21[7] = -(pgVar1->m[7].n == uVar11);
    auVar21[8] = -(pgVar1->m[8].n == uVar8);
    auVar21[9] = -(pgVar1->m[9].n == uVar9);
    auVar21[10] = -(pgVar1->m[10].n == uVar10);
    auVar21[0xb] = -(pgVar1->m[0xb].n == uVar11);
    auVar21[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar21[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar21[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar21[0xf] = -(pgVar1->m[0xf].n == uVar11);
    uVar7 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe;
    if (uVar7 != 0) {
      uVar15 = (uint)uVar7;
      do {
        uVar5 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __s2 = *(char **)(ppVar3[uVar17 * 0xf + (ulong)uVar5].first._M_target + 8);
        if (__s2 == "N5slang7parsing19PreprocessorOptionsE") {
          bVar20 = true;
        }
        else {
          iVar12 = strcmp("N5slang7parsing19PreprocessorOptionsE",__s2);
          bVar20 = iVar12 == 0;
        }
        if (bVar20) {
          unaff_RBX = ppVar3 + uVar17 * 0xf + (ulong)uVar5;
          goto LAB_0013ab77;
        }
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      if (bVar20) goto LAB_0013ab77;
    }
    if ((pgVar2[uVar17].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7]) == 0) break;
    lVar18 = uVar17 + uVar19;
    uVar19 = uVar19 + 1;
    uVar17 = lVar18 + 1U & uVar4;
  } while (uVar19 <= uVar4);
  unaff_RBX = (value_type_pointer)0x0;
LAB_0013ab77:
  if (unaff_RBX == (value_type_pointer)0x0) {
    pPVar14 = (PreprocessorOptions *)0x0;
  }
  else {
    pPVar14 = (PreprocessorOptions *)
              std::__any_caster<slang::parsing::PreprocessorOptions>(&unaff_RBX->second);
  }
  return pPVar14;
}

Assistant:

const T* get() const {
        auto it = items.find(SLANG_TYPEOF(T));
        if (it == items.end())
            return nullptr;
        return std::any_cast<T>(&it->second);
    }